

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# calendar_dates.c
# Opt level: O1

feed_db_status_t store_calendar_dates_db(calendar_date_t *record,feed_db_t *db)

{
  int iVar1;
  char *pcVar2;
  long lVar3;
  char *pcVar4;
  sqlite3_stmt *stmt;
  char qr [83];
  sqlite3_stmt *local_80;
  char local_78 [80];
  undefined2 local_28;
  undefined1 local_26;
  
  pcVar2 = "INSERT INTO calendar_dates (service_id, date, exception_type) values (?1, ?2, ?3);";
  pcVar4 = local_78;
  for (lVar3 = 10; lVar3 != 0; lVar3 = lVar3 + -1) {
    *(undefined8 *)pcVar4 = *(undefined8 *)pcVar2;
    pcVar2 = pcVar2 + 8;
    pcVar4 = pcVar4 + 8;
  }
  local_26 = 0;
  local_28 = 0x3b29;
  sqlite3_prepare_v2(db->conn,local_78,-1,&local_80,(char **)0x0);
  sqlite3_bind_text(local_80,1,record->service_id,-1,(_func_void_void_ptr *)0x0);
  sqlite3_bind_text(local_80,2,record->date,-1,(_func_void_void_ptr *)0x0);
  sqlite3_bind_int(local_80,3,record->exception_type);
  iVar1 = sqlite3_step(local_80);
  db->rc = iVar1;
  if (iVar1 != 0x65) {
    pcVar2 = sqlite3_errmsg(db->conn);
    pcVar2 = strdup(pcVar2);
    db->error_msg = pcVar2;
  }
  sqlite3_finalize(local_80);
  return (uint)(iVar1 == 0x65);
}

Assistant:

feed_db_status_t store_calendar_dates_db(calendar_date_t *record, feed_db_t *db) {
    sqlite3_stmt *stmt;
    char qr[] = "INSERT INTO calendar_dates ("
                    "service_id, date, exception_type"
                ") values ("
                    "?1, ?2, ?3"
                ");";

    sqlite3_prepare_v2(db->conn, qr, -1, &stmt, NULL);

    sqlite3_bind_text(stmt, 1, record->service_id, -1, SQLITE_STATIC);
    sqlite3_bind_text(stmt, 2, record->date, -1, SQLITE_STATIC);
    sqlite3_bind_int(stmt, 3, (int)record->exception_type);

    db->rc = sqlite3_step(stmt);
    if (db->rc != SQLITE_DONE) {
        db->error_msg = strdup(sqlite3_errmsg(db->conn));
        sqlite3_finalize(stmt);
        return FEED_DB_ERROR;
    }

    sqlite3_finalize(stmt);
    return FEED_DB_SUCCESS;
}